

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_statistics.cpp
# Opt level: O2

void __thiscall duckdb::TableStatistics::CopyStats(TableStatistics *this,TableStatistics *other)

{
  pthread_mutex_t *__mutex;
  TableStatistics *lock;
  
  lock = other;
  __mutex = (pthread_mutex_t *)shared_ptr<std::mutex,_true>::operator*(&this->stats_lock);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  CopyStats(this,(TableStatisticsLock *)lock,other);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void TableStatistics::CopyStats(TableStatistics &other) {
	TableStatisticsLock lock(*stats_lock);
	CopyStats(lock, other);
}